

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

Int __thiscall
ipx::Model::PresolveIPMStartingPoint
          (Model *this,double *x_user,double *xl_user,double *xu_user,double *slack_user,
          double *y_user,double *zl_user,double *zu_user,Vector *x_solver,Vector *xl_solver,
          Vector *xu_solver,Vector *y_solver,Vector *zl_solver,Vector *zu_solver)

{
  double dVar1;
  char cVar2;
  double *pdVar3;
  double *pdVar4;
  pointer pcVar5;
  undefined4 in_EAX;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  Int IVar10;
  size_t sVar11;
  Int i;
  double dVar12;
  undefined1 auVar13 [16];
  Vector y_temp;
  Vector slack_temp;
  Vector xu_temp;
  Vector xl_temp;
  Vector x_temp;
  Vector zl_temp;
  Vector zu_temp;
  
  auVar13._0_4_ = -(uint)(x_user == (double *)0x0);
  auVar13._4_4_ = -(uint)(xl_user == (double *)0x0);
  auVar13._8_4_ = -(uint)(xu_user == (double *)0x0);
  auVar13._12_4_ = -(uint)(slack_user == (double *)0x0);
  iVar6 = movmskps(in_EAX,auVar13);
  if (iVar6 != 0) {
    return 0x66;
  }
  if (y_user == (double *)0x0) {
    return 0x66;
  }
  if (zl_user == (double *)0x0) {
    return 0x66;
  }
  if (zu_user == (double *)0x0) {
    return 0x66;
  }
  if (this->dualized_ != false) {
    return 0x385;
  }
  sVar11 = (size_t)this->num_var_;
  x_temp._M_size = sVar11;
  x_temp._M_data = std::__valarray_get_storage<double>(sVar11);
  memcpy(x_temp._M_data,x_user,sVar11 << 3);
  sVar11 = (size_t)this->num_var_;
  xl_temp._M_size = sVar11;
  xl_temp._M_data = std::__valarray_get_storage<double>(sVar11);
  memcpy(xl_temp._M_data,xl_user,sVar11 << 3);
  sVar11 = (size_t)this->num_var_;
  xu_temp._M_size = sVar11;
  xu_temp._M_data = std::__valarray_get_storage<double>(sVar11);
  memcpy(xu_temp._M_data,xu_user,sVar11 << 3);
  sVar11 = (size_t)this->num_constr_;
  slack_temp._M_size = sVar11;
  slack_temp._M_data = std::__valarray_get_storage<double>(sVar11);
  memcpy(slack_temp._M_data,slack_user,sVar11 << 3);
  sVar11 = (size_t)this->num_constr_;
  y_temp._M_size = sVar11;
  y_temp._M_data = std::__valarray_get_storage<double>(sVar11);
  memcpy(y_temp._M_data,y_user,sVar11 << 3);
  sVar11 = (size_t)this->num_var_;
  zl_temp._M_size = sVar11;
  zl_temp._M_data = std::__valarray_get_storage<double>(sVar11);
  memcpy(zl_temp._M_data,zl_user,sVar11 << 3);
  sVar11 = (size_t)this->num_var_;
  zu_temp._M_size = sVar11;
  zu_temp._M_data = std::__valarray_get_storage<double>(sVar11);
  memcpy(zu_temp._M_data,zu_user,sVar11 << 3);
  ScalePoint(this,&x_temp,&xl_temp,&xu_temp,&slack_temp,&y_temp,&zl_temp,&zu_temp);
  uVar7 = 0;
  uVar9 = (ulong)(uint)this->num_var_;
  if (this->num_var_ < 1) {
    uVar9 = uVar7;
  }
  do {
    if (uVar9 == uVar7) {
      pdVar3 = (this->scaled_lbuser_)._M_data;
      uVar7 = 0;
      goto LAB_00387f11;
    }
    pdVar3 = x_temp._M_data + uVar7;
    uVar7 = uVar7 + 1;
  } while ((ulong)ABS(*pdVar3) < 0x7ff0000000000000);
  goto LAB_00387e8e;
  while (((dVar1 = xl_temp._M_data[uVar7], 0.0 <= dVar1 &&
          ((dVar12 = pdVar3[uVar7], INFINITY <= dVar1 || (-INFINITY < dVar12)))) &&
         ((uVar7 = uVar7 + 1, dVar1 < INFINITY || (dVar12 <= -INFINITY))))) {
LAB_00387f11:
    if (uVar9 == uVar7) {
      pdVar4 = (this->scaled_ubuser_)._M_data;
      uVar7 = 0;
      goto LAB_00387f65;
    }
  }
  goto LAB_00387e8e;
  while (((dVar1 = xu_temp._M_data[uVar7], 0.0 <= dVar1 &&
          ((dVar12 = pdVar4[uVar7], INFINITY <= dVar1 || (dVar12 < INFINITY)))) &&
         ((uVar7 = uVar7 + 1, dVar1 < INFINITY || (INFINITY <= dVar12))))) {
LAB_00387f65:
    if (uVar9 == uVar7) {
      pcVar5 = (this->constr_type_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = 0;
      uVar7 = (ulong)(uint)this->num_constr_;
      if (this->num_constr_ < 1) {
        uVar7 = uVar8;
      }
      goto LAB_00387fc9;
    }
  }
  goto LAB_00387e8e;
LAB_00387fc9:
  if (uVar7 == uVar8) goto LAB_00388029;
  dVar1 = slack_temp._M_data[uVar8];
  if (0x7fefffffffffffff < (ulong)ABS(dVar1)) goto LAB_00387e8e;
  cVar2 = pcVar5[uVar8];
  if (cVar2 == '<') {
    if (dVar1 < 0.0) goto LAB_00387e8e;
  }
  else if (cVar2 == '>') {
    if (0.0 < dVar1) goto LAB_00387e8e;
  }
  else if ((cVar2 == '=') && ((dVar1 != 0.0 || (NAN(dVar1))))) goto LAB_00387e8e;
  uVar8 = uVar8 + 1;
  goto LAB_00387fc9;
LAB_00388029:
  for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    dVar1 = y_temp._M_data[uVar8];
    if (0x7fefffffffffffff < (ulong)ABS(dVar1)) goto LAB_00387e8e;
    cVar2 = pcVar5[uVar8];
    if (cVar2 == '>') {
      if (dVar1 < 0.0) goto LAB_00387e8e;
    }
    else if ((cVar2 == '<') && (0.0 < dVar1)) goto LAB_00387e8e;
  }
  uVar7 = 0;
  do {
    uVar8 = uVar7;
    if (uVar9 == uVar8) {
      uVar7 = 0;
      goto LAB_00388149;
    }
    dVar1 = zl_temp._M_data[uVar8];
    dVar12 = ABS(dVar1);
    if ((0x7fefffffffffffff < (ulong)dVar12 ||
        (long)dVar12 - 1U < 0xfffffffffffff && (long)dVar1 < 0) ||
        (uint)((ulong)((long)dVar12 + -0x10000000000000) >> 0x35) < 0x3ff && (long)dVar1 < 0) break;
    uVar7 = uVar8 + 1;
  } while (((dVar1 == 0.0) && (!NAN(dVar1))) || (-INFINITY < pdVar3[uVar8]));
  goto LAB_00387e8e;
  while( true ) {
    uVar7 = uVar8 + 1;
    if (((dVar1 != 0.0) || (NAN(dVar1))) && (INFINITY <= pdVar4[uVar8])) break;
LAB_00388149:
    uVar8 = uVar7;
    if (uVar9 == uVar8) {
      DualizeIPMStartingPoint
                (this,&x_temp,&xl_temp,&xu_temp,&slack_temp,&y_temp,&zl_temp,&zu_temp,x_solver,
                 xl_solver,xu_solver,y_solver,zl_solver,zu_solver);
      IVar10 = 0;
      goto LAB_00387e91;
    }
    dVar1 = zu_temp._M_data[uVar8];
    dVar12 = ABS(dVar1);
    if ((0x7fefffffffffffff < (ulong)dVar12 ||
        (long)dVar12 - 1U < 0xfffffffffffff && (long)dVar1 < 0) ||
        (uint)((ulong)((long)dVar12 + -0x10000000000000) >> 0x35) < 0x3ff && (long)dVar1 < 0) break;
  }
LAB_00387e8e:
  IVar10 = 0x69;
LAB_00387e91:
  operator_delete(zu_temp._M_data);
  operator_delete(zl_temp._M_data);
  operator_delete(y_temp._M_data);
  operator_delete(slack_temp._M_data);
  operator_delete(xu_temp._M_data);
  operator_delete(xl_temp._M_data);
  operator_delete(x_temp._M_data);
  return IVar10;
}

Assistant:

Int Model::PresolveIPMStartingPoint(const double* x_user,
                                    const double* xl_user,
                                    const double* xu_user,
                                    const double* slack_user,
                                    const double* y_user,
                                    const double* zl_user,
                                    const double* zu_user,
                                    Vector& x_solver,
                                    Vector& xl_solver,
                                    Vector& xu_solver,
                                    Vector& y_solver,
                                    Vector& zl_solver,
                                    Vector& zu_solver) const {
    if (!x_user || !xl_user || !xu_user || !slack_user ||
        !y_user || !zl_user || !zu_user)
        return IPX_ERROR_argument_null;
    if (dualized_)
        return IPX_ERROR_not_implemented;

    // Copy user point into workspace and apply model scaling.
    Vector x_temp(x_user, num_var_);
    Vector xl_temp(xl_user, num_var_);
    Vector xu_temp(xu_user, num_var_);
    Vector slack_temp(slack_user, num_constr_);
    Vector y_temp(y_user, num_constr_);
    Vector zl_temp(zl_user, num_var_);
    Vector zu_temp(zu_user, num_var_);
    ScalePoint(x_temp, xl_temp, xu_temp, slack_temp,  y_temp, zl_temp, zu_temp);

    // Check that point is compatible with bounds.
    for (Int j = 0; j < num_var_; ++j) {
        if (!std::isfinite(x_temp[j]))
            return IPX_ERROR_invalid_vector;
    }
    for (Int j = 0; j < num_var_; ++j) {
        if (!(xl_temp[j] >= 0.0) ||
            (scaled_lbuser_[j] == -INFINITY && xl_temp[j] != INFINITY) ||
            (scaled_lbuser_[j] != -INFINITY && xl_temp[j] == INFINITY))
            return IPX_ERROR_invalid_vector;
    }
    for (Int j = 0; j < num_var_; ++j) {
        if (!(xu_temp[j] >= 0.0) ||
            (scaled_ubuser_[j] == INFINITY && xu_temp[j] != INFINITY) ||
            (scaled_ubuser_[j] != INFINITY && xu_temp[j] == INFINITY))
            return IPX_ERROR_invalid_vector;
    }
    for (Int i = 0; i < num_constr_; ++i) {
        if (!std::isfinite(slack_temp[i]) ||
            (constr_type_[i] == '=' && !(slack_temp[i] == 0.0)) ||
            (constr_type_[i] == '<' && !(slack_temp[i] >= 0.0)) ||
            (constr_type_[i] == '>' && !(slack_temp[i] <= 0.0)) )
            return IPX_ERROR_invalid_vector;
    }
    for (Int i = 0; i < num_constr_; ++i) {
        if (!std::isfinite(y_temp[i]) ||
            (constr_type_[i] == '<' && !(y_temp[i] <= 0.0)) ||
            (constr_type_[i] == '>' && !(y_temp[i] >= 0.0)) )
            return IPX_ERROR_invalid_vector;
    }
    for (Int j = 0; j < num_var_; ++j) {
        if (!(zl_temp[j] >= 0.0 && zl_temp[j] < INFINITY) ||
            (scaled_lbuser_[j] == -INFINITY && zl_temp[j] != 0.0))
            return IPX_ERROR_invalid_vector;
    }
    for (Int j = 0; j < num_var_; ++j) {
        if (!(zu_temp[j] >= 0.0 && zu_temp[j] < INFINITY) ||
            (scaled_ubuser_[j] == INFINITY && zu_temp[j] != 0.0))
            return IPX_ERROR_invalid_vector;
    }

    DualizeIPMStartingPoint(x_temp, xl_temp, xu_temp, slack_temp,
                            y_temp, zl_temp, zu_temp,
                            x_solver, xl_solver, xu_solver,
                            y_solver, zl_solver, zu_solver);
    return 0;
}